

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkCharText_Test::~TEST_TestHarness_c_checkCharText_Test
          (TEST_TestHarness_c_checkCharText_Test *this)

{
  TEST_TestHarness_c_checkCharText_Test *this_local;
  
  ~TEST_TestHarness_c_checkCharText_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkCharText)
{
    CHECK_EQUAL_C_CHAR_TEXT('a', 'a', "Text");
    fixture->setTestFunction(failCharTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <a>\n\tbut was  <c>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: CharTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}